

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS VerifyJsonNotString(_Bool IsJson5,char *Json)

{
  JL_STATUS JVar1;
  JL_DATA_TYPE JVar2;
  bool bVar3;
  WJTL_STATUS WStack_2c;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  WJTL_STATUS TestReturn;
  size_t errorAtPos;
  JlDataObject *object;
  char *Json_local;
  _Bool IsJson5_local;
  
  errorAtPos = 0;
  __result_3 = 100;
  WStack_2c = WJTL_STATUS_SUCCESS;
  object = (JlDataObject *)Json;
  Json_local._7_1_ = IsJson5;
  JVar1 = JlParseJsonEx(Json,IsJson5,(JlDataObject **)&errorAtPos,(size_t *)&_result_3);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "(JlParseJsonEx( Json, IsJson5, &object, &errorAtPos )) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonNotString",0x6a);
  if (JVar1 != JL_STATUS_SUCCESS) {
    WStack_2c = WJTL_STATUS_FAILED;
  }
  bVar3 = errorAtPos != 0;
  WjTestLib_Assert(bVar3,"(object) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonNotString",0x6b);
  if (!bVar3) {
    WStack_2c = WJTL_STATUS_FAILED;
  }
  JVar2 = JlGetObjectType((JlDataObject *)errorAtPos);
  WjTestLib_Assert(JVar2 != JL_DATA_TYPE_STRING,"JlGetObjectType( object ) != JL_DATA_TYPE_STRING",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonNotString",0x6c);
  if (JVar2 == JL_DATA_TYPE_STRING) {
    WStack_2c = WJTL_STATUS_FAILED;
  }
  JVar1 = JlFreeObjectTree((JlDataObject **)&errorAtPos);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &object ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonNotString",0x6d);
  if (JVar1 != JL_STATUS_SUCCESS) {
    WStack_2c = WJTL_STATUS_FAILED;
  }
  bVar3 = errorAtPos == 0;
  WjTestLib_Assert(bVar3,"(object) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonNotString",0x6e);
  if (!bVar3) {
    WStack_2c = WJTL_STATUS_FAILED;
  }
  return WStack_2c;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonNotString
    (
        bool            IsJson5,
        char const*     Json
    )
{
    JlDataObject*   object = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_STATUS( JlParseJsonEx( Json, IsJson5, &object, &errorAtPos ), JL_STATUS_SUCCESS );
    JL_ASSERT_NOT_NULL( object );
    JL_ASSERT( JlGetObjectType( object ) != JL_DATA_TYPE_STRING );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &object ) )
    JL_ASSERT_NULL( object );

    return TestReturn;
}